

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall Lowerer::FinalLower(Lowerer *this)

{
  bool bVar1;
  LabelInstr *pLVar2;
  Instr *this_00;
  
  LowererMD::FinalLower(&this->m_lowererMD);
  bVar1 = Func::HasLazyBailOut(this->m_func);
  if (bVar1) {
    InsertLazyBailOutThunk(this);
  }
  pLVar2 = Func::GetFuncStartLabel(this->m_func);
  if (pLVar2 != (LabelInstr *)0x0) {
    IR::Instr::InsertAfter(this->m_func->m_headInstr,&pLVar2->super_Instr);
  }
  pLVar2 = Func::GetFuncEndLabel(this->m_func);
  if (pLVar2 != (LabelInstr *)0x0) {
    this_00 = IR::Instr::GetPrevRealInstr(this->m_func->m_tailInstr);
    IR::Instr::InsertBefore(this_00,&pLVar2->super_Instr);
    return;
  }
  return;
}

Assistant:

void
Lowerer::FinalLower()
{
    this->m_lowererMD.FinalLower();

    // We check if there are any lazy bailouts in
    // LowererMD::FinalLower, so only insert the thunk
    // if needed
    if (this->m_func->HasLazyBailOut())
    {
        this->InsertLazyBailOutThunk();
    }

    // Ensure that the StartLabel and EndLabel are inserted
    // before the prolog and after the epilog respectively
    IR::LabelInstr * startLabel = m_func->GetFuncStartLabel();
    if (startLabel != nullptr)
    {
        m_func->m_headInstr->InsertAfter(startLabel);
    }

    IR::LabelInstr * endLabel = m_func->GetFuncEndLabel();
    if (endLabel != nullptr)
    {
        m_func->m_tailInstr->GetPrevRealInstr()->InsertBefore(endLabel);
    }
}